

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jmespath.hpp
# Opt level: O0

reference __thiscall
jsoncons::jmespath::detail::
jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
::gt_operator::evaluate
          (gt_operator *this,reference lhs,reference rhs,
          eval_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
          *context,error_code *param_5)

{
  bool bVar1;
  type_conflict9 tVar2;
  eval_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  *in_RDX;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *in_RSI;
  eval_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  *in_R8;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
  *in_stack_ffffffffffffffc8;
  reference local_8;
  
  bVar1 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::is_number
                    (in_RSI);
  if ((bVar1) &&
     (bVar1 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::is_number
                        (in_RSI), bVar1)) {
    tVar2 = operator>((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
                      in_R8,in_stack_ffffffffffffffc8);
    if (tVar2) {
      local_8 = eval_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                ::true_value(in_R8);
    }
    else {
      local_8 = eval_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                ::false_value(in_R8);
    }
  }
  else {
    local_8 = eval_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
              ::null_value(in_RDX);
  }
  return local_8;
}

Assistant:

reference evaluate(reference lhs, reference rhs, eval_context<Json>& context, std::error_code&) const override
            {
                if (!(lhs.is_number() && rhs.is_number()))
                {
                    return context.null_value();
                }
                return lhs > rhs ? context.true_value() : context.false_value();
            }